

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

void __thiscall xLearn::Solver::Initialize(Solver *this,HyperParam *hyper_param)

{
  DMatrix *pDVar1;
  bool bVar2;
  real_t rVar3;
  int iVar4;
  bool bVar5;
  undefined2 uVar6;
  index_t iVar7;
  index_t iVar8;
  index_t iVar9;
  index_t iVar10;
  index_t iVar11;
  real_t rVar12;
  real_t rVar13;
  real_t rVar14;
  real_t rVar15;
  real_t rVar16;
  real_t rVar17;
  real_t rVar18;
  undefined1 uVar19;
  bool bVar20;
  undefined3 uVar21;
  int iVar22;
  bool bVar23;
  bool bVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  bool bVar29;
  undefined3 uVar30;
  int iVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  undefined1 uVar35;
  int iVar36;
  bool bVar37;
  undefined3 uVar38;
  int iVar39;
  bool bVar40;
  bool bVar41;
  undefined2 uVar42;
  
  print_logo(this);
  checker(this,hyper_param);
  (this->hyper_param_).quiet = hyper_param->quiet;
  bVar2 = hyper_param->on_disk;
  (this->hyper_param_).is_train = hyper_param->is_train;
  (this->hyper_param_).on_disk = bVar2;
  std::__cxx11::string::_M_assign((string *)&(this->hyper_param_).score_func);
  std::__cxx11::string::_M_assign((string *)&(this->hyper_param_).loss_func);
  std::__cxx11::string::_M_assign((string *)&(this->hyper_param_).metric);
  (this->hyper_param_).thread_number = hyper_param->thread_number;
  std::__cxx11::string::_M_assign((string *)&(this->hyper_param_).opt_type);
  iVar11 = hyper_param->auxiliary_size;
  rVar12 = hyper_param->learning_rate;
  rVar13 = hyper_param->regu_lambda;
  rVar14 = hyper_param->model_scale;
  rVar15 = hyper_param->alpha;
  rVar16 = hyper_param->beta;
  rVar17 = hyper_param->lambda_1;
  rVar18 = hyper_param->lambda_2;
  rVar3 = hyper_param->lambda_2;
  iVar4 = hyper_param->num_epoch;
  bVar2 = hyper_param->norm;
  bVar5 = hyper_param->lock_free;
  uVar6 = *(undefined2 *)&hyper_param->field_0xb6;
  iVar7 = hyper_param->num_feature;
  iVar8 = hyper_param->num_param;
  iVar9 = hyper_param->num_K;
  iVar10 = hyper_param->num_field;
  (this->hyper_param_).lambda_1 = hyper_param->lambda_1;
  (this->hyper_param_).lambda_2 = rVar3;
  (this->hyper_param_).num_epoch = iVar4;
  (this->hyper_param_).norm = bVar2;
  (this->hyper_param_).lock_free = bVar5;
  *(undefined2 *)&(this->hyper_param_).field_0xb6 = uVar6;
  (this->hyper_param_).num_feature = iVar7;
  (this->hyper_param_).num_param = iVar8;
  (this->hyper_param_).num_K = iVar9;
  (this->hyper_param_).num_field = iVar10;
  (this->hyper_param_).auxiliary_size = iVar11;
  (this->hyper_param_).learning_rate = rVar12;
  (this->hyper_param_).regu_lambda = rVar13;
  (this->hyper_param_).model_scale = rVar14;
  (this->hyper_param_).alpha = rVar15;
  (this->hyper_param_).beta = rVar16;
  (this->hyper_param_).lambda_1 = rVar17;
  (this->hyper_param_).lambda_2 = rVar18;
  std::__cxx11::string::_M_assign((string *)&(this->hyper_param_).train_set_file);
  std::__cxx11::string::_M_assign((string *)&(this->hyper_param_).test_set_file);
  std::__cxx11::string::_M_assign((string *)&(this->hyper_param_).validate_set_file);
  (this->hyper_param_).valid_dataset = hyper_param->valid_dataset;
  pDVar1 = hyper_param->test_dataset;
  (this->hyper_param_).train_dataset = hyper_param->train_dataset;
  (this->hyper_param_).test_dataset = pDVar1;
  std::__cxx11::string::_M_assign((string *)&(this->hyper_param_).model_file);
  std::__cxx11::string::_M_assign((string *)&(this->hyper_param_).pre_model_file);
  std::__cxx11::string::_M_assign((string *)&(this->hyper_param_).txt_model_file);
  std::__cxx11::string::_M_assign((string *)&(this->hyper_param_).output_file);
  std::__cxx11::string::_M_assign((string *)&(this->hyper_param_).log_file);
  iVar28 = hyper_param->block_size;
  bVar29 = hyper_param->bin_out;
  uVar30 = *(undefined3 *)&hyper_param->field_0x1e5;
  iVar31 = hyper_param->seed;
  bVar32 = hyper_param->from_file;
  bVar33 = hyper_param->res_out;
  bVar34 = hyper_param->cross_validation;
  uVar35 = hyper_param->field_0x1ef;
  iVar36 = hyper_param->num_folds;
  bVar37 = hyper_param->early_stop;
  uVar38 = *(undefined3 *)&hyper_param->field_0x1f5;
  iVar39 = hyper_param->stop_window;
  bVar40 = hyper_param->sign;
  bVar41 = hyper_param->sigmoid;
  uVar42 = *(undefined2 *)&hyper_param->field_0x1fe;
  bVar2 = hyper_param->res_out;
  bVar5 = hyper_param->cross_validation;
  uVar19 = hyper_param->field_0x1ef;
  iVar4 = hyper_param->num_folds;
  bVar20 = hyper_param->early_stop;
  uVar21 = *(undefined3 *)&hyper_param->field_0x1f5;
  iVar22 = hyper_param->stop_window;
  bVar23 = hyper_param->sign;
  bVar24 = hyper_param->sigmoid;
  uVar6 = *(undefined2 *)&hyper_param->field_0x1fe;
  iVar25 = hyper_param->batch_size;
  iVar26 = hyper_param->num_worker;
  iVar27 = hyper_param->num_server;
  (this->hyper_param_).from_file = hyper_param->from_file;
  (this->hyper_param_).res_out = bVar2;
  (this->hyper_param_).cross_validation = bVar5;
  (this->hyper_param_).field_0x1ef = uVar19;
  (this->hyper_param_).num_folds = iVar4;
  (this->hyper_param_).early_stop = bVar20;
  *(undefined3 *)&(this->hyper_param_).field_0x1f5 = uVar21;
  (this->hyper_param_).stop_window = iVar22;
  (this->hyper_param_).sign = bVar23;
  (this->hyper_param_).sigmoid = bVar24;
  *(undefined2 *)&(this->hyper_param_).field_0x1fe = uVar6;
  (this->hyper_param_).batch_size = iVar25;
  (this->hyper_param_).num_worker = iVar26;
  (this->hyper_param_).num_server = iVar27;
  (this->hyper_param_).block_size = iVar28;
  (this->hyper_param_).bin_out = bVar29;
  *(undefined3 *)&(this->hyper_param_).field_0x1e5 = uVar30;
  (this->hyper_param_).seed = iVar31;
  (this->hyper_param_).from_file = bVar32;
  (this->hyper_param_).res_out = bVar33;
  (this->hyper_param_).cross_validation = bVar34;
  (this->hyper_param_).field_0x1ef = uVar35;
  (this->hyper_param_).num_folds = iVar36;
  (this->hyper_param_).early_stop = bVar37;
  *(undefined3 *)&(this->hyper_param_).field_0x1f5 = uVar38;
  (this->hyper_param_).stop_window = iVar39;
  (this->hyper_param_).sign = bVar40;
  (this->hyper_param_).sigmoid = bVar41;
  *(undefined2 *)&(this->hyper_param_).field_0x1fe = uVar42;
  init_log(this);
  if ((this->hyper_param_).is_train == true) {
    init_train(this);
    return;
  }
  init_predict(this);
  return;
}

Assistant:

void Solver::Initialize(HyperParam& hyper_param) {
  // Print logo
  print_logo();
  // Check the arguments
  checker(hyper_param);
  this->hyper_param_ = hyper_param;
  // Initialize log file
  init_log();
  // Init train or predict
  if (hyper_param_.is_train) {
    init_train();
  } else {
    init_predict();
  }
}